

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool operator<(CNetAddr *a,CNetAddr *b)

{
  weak_ordering wVar1;
  long in_FS_OFFSET;
  CNetAddr *local_28;
  Network *local_20;
  CNetAddr *local_18;
  Network *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &a->m_net;
  local_20 = &b->m_net;
  wVar1._M_value = -(a->m_net < b->m_net);
  local_28 = b;
  local_18 = a;
  if (a->m_net == b->m_net) {
    wVar1 = std::
            __tuple_cmp<std::weak_ordering,_std::tuple<const_Network_&,_const_prevector<16U,_unsigned_char,_unsigned_int,_int>_&>,_std::tuple<const_Network_&,_const_prevector<16U,_unsigned_char,_unsigned_int,_int>_&>,_1UL>
                      (&local_18,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)((byte)wVar1._M_value >> 7);
}

Assistant:

bool operator<(const CNetAddr& a, const CNetAddr& b)
{
    return std::tie(a.m_net, a.m_addr) < std::tie(b.m_net, b.m_addr);
}